

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O3

Var Js::WebAssemblyTable::EntryGrow(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Var pvVar8;
  WebAssemblyTable *pWVar9;
  RecyclableObject *val;
  Recycler *this;
  WriteBarrierPtr<void> *dst;
  uint64 uVar10;
  uint64 uVar11;
  Type ppvVar12;
  uint uVar13;
  int in_stack_00000010;
  undefined1 local_80 [8];
  TrackAllocData data;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  data._32_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d919d3;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_48,(CallInfo *)&data.line);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((data._32_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x5d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d919d3;
    *puVar7 = 0;
  }
  if (((ulong)local_48 & 0xffffff) == 0) {
LAB_00d919c4:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5e49c,(PCWSTR)0x0);
  }
  pvVar8 = Arguments::operator[]((Arguments *)local_48,0);
  bVar4 = VarIs<Js::WebAssemblyTable>(pvVar8);
  if (!bVar4) goto LAB_00d919c4;
  pvVar8 = Arguments::operator[]((Arguments *)local_48,0);
  pWVar9 = VarTo<Js::WebAssemblyTable>(pvVar8);
  uVar1 = pWVar9->m_currentLength;
  if (((ulong)local_48 & 0xfffffe) == 0) {
    val = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          undefinedValue.ptr;
  }
  else {
    val = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,1);
  }
  uVar5 = WebAssembly::ToNonWrappingUint32(val,pSVar2);
  if (uVar5 != 0) {
    uVar13 = uVar5 + pWVar9->m_currentLength;
    if ((CARRY4(uVar5,pWVar9->m_currentLength)) || (pWVar9->m_maxLength < uVar13)) {
      JavascriptError::ThrowRangeError(pSVar2,-0x7ff5ebf6,(PCWSTR)0x0);
    }
    ppvVar12 = (Type)(ulong)uVar13;
    local_80 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9771b28;
    data.filename._0_4_ = 0x70;
    data.plusSize = (size_t)ppvVar12;
    this = Memory::Recycler::TrackAllocInfo(pSVar2->recycler,(TrackAllocData *)local_80);
    args.super_Arguments.Values = ppvVar12;
    if (uVar13 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
      dst = (WriteBarrierPtr<void> *)&DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00d919d3;
        *puVar7 = 0;
        ppvVar12 = args.super_Arguments.Values;
      }
      dst = (WriteBarrierPtr<void> *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (this,(long)ppvVar12 * 8);
      if (dst == (WriteBarrierPtr<void> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00d919d3;
        *puVar7 = 0;
      }
      memset(dst,0,(long)ppvVar12 * 8);
    }
    Memory::CopyArray<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (dst,(size_t)args.super_Arguments.Values,(pWVar9->m_values).ptr,
               (ulong)pWVar9->m_currentLength);
    Memory::Recycler::WBSetBit((char *)&pWVar9->m_values);
    (pWVar9->m_values).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pWVar9->m_values);
    pWVar9->m_currentLength = uVar13;
  }
  if ((int)uVar1 < 0) {
    args.super_Arguments.Values = (Type)(double)uVar1;
    uVar10 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values);
    bVar4 = NumberUtilities::IsNan((double)args.super_Arguments.Values);
    if (bVar4) {
      uVar11 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values);
      if (uVar11 != 0xfff8000000000000) {
        uVar11 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values);
        if (uVar11 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar4) {
LAB_00d919d3:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
      }
    }
    pvVar8 = (Var)(uVar10 ^ 0xfffc000000000000);
  }
  else {
    pvVar8 = (Var)((ulong)uVar1 | 0x1000000000000);
  }
  return pvVar8;
}

Assistant:

Var
WebAssemblyTable::EntryGrow(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);
    uint32 oldLength = table->m_currentLength;

    Var deltaVar = args.Info.Count >= 2 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    uint32 delta = WebAssembly::ToNonWrappingUint32(deltaVar, scriptContext);
    if (delta > 0)
    {
        uint32 newLength = 0;
        if (UInt32Math::Add(table->m_currentLength, delta, &newLength) || newLength > table->m_maxLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
        }

        Field(Var) * newValues = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), newLength);
        CopyArray(newValues, newLength, table->m_values, table->m_currentLength);

        table->m_values = newValues;
        table->m_currentLength = newLength;
    }

    return JavascriptNumber::ToVar(oldLength, scriptContext);
}